

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

Generator<std::tuple<int>_> __thiscall cppqc::tupleOf<int>(cppqc *this,Generator<int> *g)

{
  undefined4 extraout_var;
  TupleGenerator<int> local_10;
  
  local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<int>_>.
  super__Head_base<0UL,_cppqc::Generator<int>,_false>._M_head_impl.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl._0_4_ =
       (*((g->m_gen)._M_t.
          super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
          .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl)->
         _vptr_GenConcept[4])();
  local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<int>_>.
  super__Head_base<0UL,_cppqc::Generator<int>,_false>._M_head_impl.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl._4_4_ = extraout_var;
  Generator<std::tuple<int>>::Generator<cppqc::detail::TupleGenerator<int>>
            ((Generator<std::tuple<int>> *)this,&local_10);
  if ((_Tuple_impl<0UL,_cppqc::Generator<int>_>)
      local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<int>_>.
      super__Head_base<0UL,_cppqc::Generator<int>,_false>._M_head_impl.m_gen._M_t.
      super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
      .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl !=
      (Generator<int>)0x0) {
    (**(code **)(*(long *)local_10.m_gen.super__Tuple_impl<0UL,_cppqc::Generator<int>_>.
                          super__Head_base<0UL,_cppqc::Generator<int>,_false>._M_head_impl.m_gen.
                          _M_t.
                          super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                          .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>.
                          _M_head_impl + 8))();
  }
  return (unique_ptr<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
          )(unique_ptr<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
            )this;
}

Assistant:

Generator<std::tuple<T...>> tupleOf(const Generator<T>&... g) {
  return detail::TupleGenerator<T...>(g...);
}